

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChVariablesBodyOwnMass.cpp
# Opt level: O1

void __thiscall
chrono::ChVariablesBodyOwnMass::ArchiveIN(ChVariablesBodyOwnMass *this,ChArchiveIn *marchive)

{
  undefined8 uVar1;
  bool bVar2;
  undefined1 auVar3 [16];
  
  ChArchiveIn::VersionRead<chrono::ChVariablesBodyOwnMass>(marchive);
  (**(code **)(*(long *)marchive + 0x20))(marchive);
  auVar3._8_8_ = 0;
  auVar3._0_8_ = this->mass;
  uVar1 = vcmpsd_avx512f(auVar3,ZEXT816(0) << 0x40,4);
  bVar2 = (bool)((byte)uVar1 & 1);
  this->inv_mass =
       (double)((ulong)bVar2 * (long)(1.0 / this->mass) + (ulong)!bVar2 * 0x4693b8b5b5056e17);
  return;
}

Assistant:

void ChVariablesBodyOwnMass::ArchiveIN(ChArchiveIn& marchive) {
    // version number
    /*int version =*/ marchive.VersionRead<ChVariablesBodyOwnMass>();
    // deserialize parent class
    ChVariablesBody::ArchiveIN(marchive);
    // stream in all member data:
    marchive >> CHNVP(mass);
    ////marchive >> CHNVP(inertia);
    SetBodyMass(mass);
    ////SetBodyInertia(inertia);
}